

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamZ.cpp
# Opt level: O2

void __thiscall OpenMD::TetrahedralityParamZ::writeQz(TetrahedralityParamZ *this)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  pointer pdVar4;
  char cVar5;
  double *pdVar6;
  ostream *poVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double local_258;
  ofstream qZstream;
  
  pdVar2 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_258 = 0.0;
  for (pdVar6 = pdVar2; pdVar6 != pdVar3; pdVar6 = pdVar6 + 1) {
    local_258 = local_258 + *pdVar6;
  }
  std::ofstream::ofstream
            (&qZstream,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    snprintf(painCave.errMsg,2000,"TetrahedralityParamZ: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar7 = std::operator<<((ostream *)&qZstream,"#Tetrahedrality Parameters (");
    poVar7 = std::operator<<(poVar7,(string *)&this->axisLabel_);
    std::operator<<(poVar7,")\n");
    poVar7 = std::operator<<((ostream *)&qZstream,"#nFrames:\t");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)&qZstream,"#selection 1: (");
    poVar7 = std::operator<<(poVar7,(string *)&this->selectionScript1_);
    std::operator<<(poVar7,")\n");
    poVar7 = std::operator<<((ostream *)&qZstream,"#selection 2: (");
    poVar7 = std::operator<<(poVar7,(string *)&this->selectionScript2_);
    std::operator<<(poVar7,")\n");
    poVar7 = std::operator<<((ostream *)&qZstream,"#");
    poVar7 = std::operator<<(poVar7,(string *)&this->axisLabel_);
    std::operator<<(poVar7,"\tQk\n");
    lVar11 = (long)pdVar3 - (long)pdVar2;
    lVar12 = lVar11 >> 3;
    auVar14._8_4_ = (int)(lVar11 >> 0x23);
    auVar14._0_8_ = lVar12;
    auVar14._12_4_ = 0x45300000;
    uVar9 = 0;
    while( true ) {
      uVar10 = (ulong)uVar9;
      pdVar4 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = (long)(this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar4;
      uVar8 = lVar11 >> 3;
      if (uVar8 <= uVar10) break;
      auVar18._8_4_ = (int)(lVar11 >> 0x23);
      auVar18._0_8_ = uVar8;
      auVar18._12_4_ = 0x45300000;
      iVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      if (iVar1 != 0) {
        dVar15 = (double)iVar1;
        dVar16 = pdVar4[uVar10] / dVar15;
        dVar15 = (this->sliceQ2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10] / dVar15 - dVar16 * dVar16;
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        dVar17 = (((double)uVar10 + 0.5) *
                 (local_258 /
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)))) /
                 ((auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0));
        iVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        if (iVar1 == 1) {
          poVar7 = std::ostream::_M_insert<double>(dVar17);
          std::operator<<(poVar7,"\t");
          poVar7 = std::ostream::_M_insert<double>(dVar16);
          std::operator<<(poVar7,"\n");
        }
        else {
          dVar13 = (double)(iVar1 + -1);
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          poVar7 = std::ostream::_M_insert<double>(dVar17);
          std::operator<<(poVar7,"\t");
          poVar7 = std::ostream::_M_insert<double>(dVar16);
          std::operator<<(poVar7,"\t");
          poVar7 = std::ostream::_M_insert<double>((dVar15 * 1.96) / dVar13);
          std::operator<<(poVar7,"\n");
        }
      }
      uVar9 = uVar9 + 1;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&qZstream);
  return;
}

Assistant:

void TetrahedralityParamZ::writeQz() {
    // compute average box length:

    RealType zSum = 0.0;
    for (std::vector<RealType>::iterator j = zBox_.begin(); j != zBox_.end();
         ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    std::ofstream qZstream(outputFilename_.c_str());
    if (qZstream.is_open()) {
      qZstream << "#Tetrahedrality Parameters (" << axisLabel_ << ")\n";

      qZstream << "#nFrames:\t" << zBox_.size() << "\n";
      qZstream << "#selection 1: (" << selectionScript1_ << ")\n";
      qZstream << "#selection 2: (" << selectionScript2_ << ")\n";
      qZstream << "#" << axisLabel_ << "\tQk\n";
      for (unsigned int i = 0; i < sliceQ_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / sliceQ_.size();
        if (sliceCount_[i] != 0) {
          RealType mean   = sliceQ_[i] / sliceCount_[i];
          RealType stdDev = sqrt(sliceQ2_[i] / sliceCount_[i] - mean * mean);
          if (sliceCount_[i] == 1) {
            qZstream << z << "\t" << mean << "\n";
          } else {
            RealType e95 = 1.96 * stdDev / sqrt(sliceCount_[i] - 1);
            qZstream << z << "\t" << mean << "\t" << e95 << "\n";
          }
        }
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "TetrahedralityParamZ: unable to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    qZstream.close();
  }